

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O3

vector<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
* __thiscall
Corrade::Utility::ConfigurationGroup::groups
          (vector<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
           *__return_storage_ptr__,ConfigurationGroup *this,string *name)

{
  pointer *pppCVar1;
  pointer pGVar2;
  size_t __n;
  iterator __position;
  int iVar3;
  Group *group;
  pointer pGVar4;
  
  (__return_storage_ptr__->
  super__Vector_base<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pGVar2 = (this->_groups).
           super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pGVar4 = (this->_groups).
                super__Vector_base<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                ._M_impl.super__Vector_impl_data._M_start; pGVar4 != pGVar2; pGVar4 = pGVar4 + 1) {
    __n = (pGVar4->name)._M_string_length;
    if ((__n == name->_M_string_length) &&
       ((__n == 0 ||
        (iVar3 = bcmp((pGVar4->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n), iVar3 == 0))))
    {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Corrade::Utility::ConfigurationGroup*,std::allocator<Corrade::Utility::ConfigurationGroup*>>
        ::_M_realloc_insert<Corrade::Utility::ConfigurationGroup*const&>
                  ((vector<Corrade::Utility::ConfigurationGroup*,std::allocator<Corrade::Utility::ConfigurationGroup*>>
                    *)__return_storage_ptr__,__position,&pGVar4->group);
      }
      else {
        *__position._M_current = pGVar4->group;
        pppCVar1 = &(__return_storage_ptr__->
                    super__Vector_base<Corrade::Utility::ConfigurationGroup_*,_std::allocator<Corrade::Utility::ConfigurationGroup_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar1 = *pppCVar1 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ConfigurationGroup*> ConfigurationGroup::groups(const std::string& name) {
    std::vector<ConfigurationGroup*> found;

    for(Group& group: _groups)
        if(group.name == name) found.push_back(group.group);

    return found;
}